

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image_resize.h
# Opt level: O3

void stbir__encode_scanline
               (stbir__info *stbir_info,int num_pixels,void *output_buffer,float *encode_buffer,
               int channels,int alpha_channel,int decode)

{
  int iVar1;
  ulong uVar2;
  int iVar3;
  ulong uVar4;
  long lVar5;
  ulong uVar6;
  float fVar7;
  float fVar8;
  double dVar9;
  stbir_uint16 nonalpha [64];
  ushort auStack_b8 [68];
  
  if (0 < num_pixels && (stbir_info->flags & 1) == 0) {
    uVar2 = 0;
    uVar6 = 0;
    do {
      if (0 < channels) {
        fVar7 = encode_buffer[(long)alpha_channel + uVar6 * (long)channels];
        uVar4 = 0;
        do {
          if ((uint)alpha_channel != uVar4) {
            encode_buffer[uVar2 + uVar4] =
                 encode_buffer[uVar2 + uVar4] * (float)(-(uint)(fVar7 != 0.0) & (uint)(1.0 / fVar7))
            ;
          }
          uVar4 = uVar4 + 1;
        } while ((uint)channels != uVar4);
      }
      uVar6 = uVar6 + 1;
      uVar2 = (ulong)(uint)((int)uVar2 + channels);
    } while (uVar6 != (uint)num_pixels);
  }
  if (channels < 1) {
    uVar2 = 0;
  }
  else {
    iVar1 = 0;
    uVar2 = 0;
    do {
      if ((alpha_channel != iVar1) || ((stbir_info->flags & 2) != 0)) {
        iVar3 = (int)uVar2;
        uVar2 = (ulong)(iVar3 + 1);
        auStack_b8[iVar3] = (ushort)iVar1;
      }
      iVar1 = iVar1 + 1;
    } while (channels != iVar1);
  }
  iVar1 = (int)uVar2;
  switch(decode) {
  case 0:
    if (0 < num_pixels) {
      uVar2 = 0;
      uVar6 = 0;
      do {
        if (0 < channels) {
          uVar4 = 0;
          do {
            fVar7 = encode_buffer[uVar2 + uVar4];
            fVar8 = 1.0;
            if (fVar7 <= 1.0) {
              fVar8 = fVar7;
            }
            *(char *)((long)output_buffer + uVar4 + uVar2) =
                 (char)(int)((float)(~-(uint)(fVar7 < 0.0) & (uint)(fVar8 * 255.0)) + 0.5);
            uVar4 = uVar4 + 1;
          } while ((uint)channels != uVar4);
        }
        uVar6 = uVar6 + 1;
        uVar2 = (ulong)(uint)((int)uVar2 + channels);
      } while (uVar6 != (uint)num_pixels);
    }
    break;
  case 1:
    if (0 < num_pixels) {
      uVar6 = 0;
      do {
        if (0 < iVar1) {
          uVar4 = 0;
          do {
            lVar5 = (ulong)auStack_b8[uVar4] + uVar6 * (long)channels;
            fVar7 = encode_buffer[lVar5];
            if (fVar7 <= 0.00012207031) {
              fVar7 = 0.00012207031;
            }
            fVar8 = 0.99999994;
            if (fVar7 <= 0.99999994) {
              fVar8 = fVar7;
            }
            *(char *)((long)output_buffer + lVar5) =
                 (char)(((uint)fVar8 >> 0xc & 0xff) *
                        (fp32_to_srgb8_tab4[(int)fVar8 + 0xc7000000U >> 0x14] & 0xffff) +
                        (fp32_to_srgb8_tab4[(int)fVar8 + 0xc7000000U >> 0x14] >> 7 & 0xfffe00) >>
                       0x10);
            uVar4 = uVar4 + 1;
          } while (uVar2 != uVar4);
        }
        if ((stbir_info->flags & 2) == 0) {
          lVar5 = uVar6 * (long)channels + (long)alpha_channel;
          fVar7 = encode_buffer[lVar5];
          fVar8 = 1.0;
          if (fVar7 <= 1.0) {
            fVar8 = fVar7;
          }
          *(char *)((long)output_buffer + lVar5) =
               (char)(int)((float)(~-(uint)(fVar7 < 0.0) & (uint)(fVar8 * 255.0)) + 0.5);
        }
        uVar6 = uVar6 + 1;
      } while (uVar6 != (uint)num_pixels);
    }
    break;
  case 2:
    if (0 < num_pixels) {
      uVar2 = 0;
      uVar6 = 0;
      do {
        if (0 < channels) {
          uVar4 = 0;
          do {
            fVar7 = encode_buffer[uVar2 + uVar4];
            fVar8 = 1.0;
            if (fVar7 <= 1.0) {
              fVar8 = fVar7;
            }
            *(short *)((long)output_buffer + uVar4 * 2 + uVar2 * 2) =
                 (short)(int)((float)(~-(uint)(fVar7 < 0.0) & (uint)(fVar8 * 65535.0)) + 0.5);
            uVar4 = uVar4 + 1;
          } while ((uint)channels != uVar4);
        }
        uVar6 = uVar6 + 1;
        uVar2 = (ulong)(uint)((int)uVar2 + channels);
      } while (uVar6 != (uint)num_pixels);
    }
    break;
  case 3:
    if (0 < num_pixels) {
      uVar6 = 0;
      do {
        if (0 < iVar1) {
          uVar4 = 0;
          do {
            lVar5 = (ulong)auStack_b8[uVar4] + uVar6 * (long)channels;
            fVar7 = encode_buffer[lVar5];
            fVar8 = 1.0;
            if (fVar7 <= 1.0) {
              fVar8 = fVar7;
            }
            fVar8 = (float)(~-(uint)(fVar7 < 0.0) & (uint)fVar8);
            if (fVar8 <= 0.0031308) {
              fVar8 = fVar8 * 12.92;
            }
            else {
              dVar9 = pow((double)fVar8,0.4166666567325592);
              fVar8 = (float)dVar9 * 1.055 + -0.055;
            }
            *(short *)((long)output_buffer + lVar5 * 2) = (short)(int)(fVar8 * 65535.0 + 0.5);
            uVar4 = uVar4 + 1;
          } while (uVar2 != uVar4);
        }
        if ((stbir_info->flags & 2) == 0) {
          lVar5 = uVar6 * (long)channels + (long)alpha_channel;
          fVar7 = encode_buffer[lVar5];
          fVar8 = 1.0;
          if (fVar7 <= 1.0) {
            fVar8 = fVar7;
          }
          *(short *)((long)output_buffer + lVar5 * 2) =
               (short)(int)((float)(~-(uint)(fVar7 < 0.0) & (uint)(fVar8 * 65535.0)) + 0.5);
        }
        uVar6 = uVar6 + 1;
      } while (uVar6 != (uint)num_pixels);
    }
    break;
  case 4:
    if (0 < num_pixels) {
      uVar2 = 0;
      uVar6 = 0;
      do {
        if (0 < channels) {
          uVar4 = 0;
          do {
            fVar7 = encode_buffer[uVar2 + uVar4];
            fVar8 = 1.0;
            if (fVar7 <= 1.0) {
              fVar8 = fVar7;
            }
            *(int *)((long)output_buffer + uVar4 * 4 + uVar2 * 4) =
                 (int)(long)((float)(~-(uint)(fVar7 < 0.0) & (uint)fVar8) * 4.2949673e+09 + 0.5);
            uVar4 = uVar4 + 1;
          } while ((uint)channels != uVar4);
        }
        uVar6 = uVar6 + 1;
        uVar2 = (ulong)(uint)((int)uVar2 + channels);
      } while (uVar6 != (uint)num_pixels);
    }
    break;
  case 5:
    if (0 < num_pixels) {
      uVar6 = 0;
      do {
        if (0 < iVar1) {
          uVar4 = 0;
          do {
            lVar5 = (ulong)auStack_b8[uVar4] + uVar6 * (long)channels;
            fVar7 = encode_buffer[lVar5];
            fVar8 = 1.0;
            if (fVar7 <= 1.0) {
              fVar8 = fVar7;
            }
            fVar8 = (float)(~-(uint)(fVar7 < 0.0) & (uint)fVar8);
            if (fVar8 <= 0.0031308) {
              fVar8 = fVar8 * 12.92;
            }
            else {
              dVar9 = pow((double)fVar8,0.4166666567325592);
              fVar8 = (float)dVar9 * 1.055 + -0.055;
            }
            *(int *)((long)output_buffer + lVar5 * 4) = (int)(long)(fVar8 * 4.2949673e+09 + 0.5);
            uVar4 = uVar4 + 1;
          } while (uVar2 != uVar4);
        }
        if ((stbir_info->flags & 2) == 0) {
          lVar5 = uVar6 * (long)channels + (long)alpha_channel;
          fVar7 = encode_buffer[lVar5];
          fVar8 = 1.0;
          if (fVar7 <= 1.0) {
            fVar8 = fVar7;
          }
          *(int *)((long)output_buffer + lVar5 * 4) =
               (int)((float)(~-(uint)(fVar7 < 0.0) & (uint)fVar8) * 4.2949673e+09 + 0.5);
        }
        uVar6 = uVar6 + 1;
      } while (uVar6 != (uint)num_pixels);
    }
    break;
  case 6:
    if (0 < num_pixels) {
      uVar2 = 0;
      uVar6 = 0;
      do {
        if (0 < channels) {
          uVar4 = 0;
          do {
            *(float *)((long)output_buffer + uVar4 * 4 + uVar2 * 4) = encode_buffer[uVar2 + uVar4];
            uVar4 = uVar4 + 1;
          } while ((uint)channels != uVar4);
        }
        uVar6 = uVar6 + 1;
        uVar2 = (ulong)(uint)((int)uVar2 + channels);
      } while (uVar6 != (uint)num_pixels);
    }
    break;
  case 7:
    if (0 < num_pixels) {
      uVar6 = 0;
      do {
        if (0 < iVar1) {
          uVar4 = 0;
          do {
            lVar5 = (ulong)auStack_b8[uVar4] + uVar6 * (long)channels;
            fVar7 = encode_buffer[lVar5];
            if (fVar7 <= 0.0031308) {
              fVar7 = fVar7 * 12.92;
            }
            else {
              dVar9 = pow((double)fVar7,0.4166666567325592);
              fVar7 = (float)dVar9 * 1.055 + -0.055;
            }
            *(float *)((long)output_buffer + lVar5 * 4) = fVar7;
            uVar4 = uVar4 + 1;
          } while (uVar2 != uVar4);
        }
        if ((stbir_info->flags & 2) == 0) {
          lVar5 = uVar6 * (long)channels + (long)alpha_channel;
          *(float *)((long)output_buffer + lVar5 * 4) = encode_buffer[lVar5];
        }
        uVar6 = uVar6 + 1;
      } while (uVar6 != (uint)num_pixels);
    }
    break;
  default:
    __assert_fail("!\"Unknown type/colorspace/channels combination.\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/reidevries[P]batchglprocess/raylib-3.7.0/src/external/stb_image_resize.h"
                  ,0x746,
                  "void stbir__encode_scanline(stbir__info *, int, void *, float *, int, int, int)")
    ;
  }
  return;
}

Assistant:

static void stbir__encode_scanline(stbir__info* stbir_info, int num_pixels, void *output_buffer, float *encode_buffer, int channels, int alpha_channel, int decode)
{
    int x;
    int n;
    int num_nonalpha;
    stbir_uint16 nonalpha[STBIR_MAX_CHANNELS];

    if (!(stbir_info->flags&STBIR_FLAG_ALPHA_PREMULTIPLIED))
    {
        for (x=0; x < num_pixels; ++x)
        {
            int pixel_index = x*channels;

            float alpha = encode_buffer[pixel_index + alpha_channel];
            float reciprocal_alpha = alpha ? 1.0f / alpha : 0;

            // unrolling this produced a 1% slowdown upscaling a large RGBA linear-space image on my machine - stb
            for (n = 0; n < channels; n++)
                if (n != alpha_channel)
                    encode_buffer[pixel_index + n] *= reciprocal_alpha;

            // We added in a small epsilon to prevent the color channel from being deleted with zero alpha.
            // Because we only add it for integer types, it will automatically be discarded on integer
            // conversion, so we don't need to subtract it back out (which would be problematic for
            // numeric precision reasons).
        }
    }

    // build a table of all channels that need colorspace correction, so
    // we don't perform colorspace correction on channels that don't need it.
    for (x = 0, num_nonalpha = 0; x < channels; ++x)
    {
        if (x != alpha_channel || (stbir_info->flags & STBIR_FLAG_ALPHA_USES_COLORSPACE))
        {
            nonalpha[num_nonalpha++] = (stbir_uint16)x;
        }
    }

    #define STBIR__ROUND_INT(f)    ((int)          ((f)+0.5))
    #define STBIR__ROUND_UINT(f)   ((stbir_uint32) ((f)+0.5))

    #ifdef STBIR__SATURATE_INT
    #define STBIR__ENCODE_LINEAR8(f)   stbir__saturate8 (STBIR__ROUND_INT((f) * stbir__max_uint8_as_float ))
    #define STBIR__ENCODE_LINEAR16(f)  stbir__saturate16(STBIR__ROUND_INT((f) * stbir__max_uint16_as_float))
    #else
    #define STBIR__ENCODE_LINEAR8(f)   (unsigned char ) STBIR__ROUND_INT(stbir__saturate(f) * stbir__max_uint8_as_float )
    #define STBIR__ENCODE_LINEAR16(f)  (unsigned short) STBIR__ROUND_INT(stbir__saturate(f) * stbir__max_uint16_as_float)
    #endif

    switch (decode)
    {
        case STBIR__DECODE(STBIR_TYPE_UINT8, STBIR_COLORSPACE_LINEAR):
            for (x=0; x < num_pixels; ++x)
            {
                int pixel_index = x*channels;

                for (n = 0; n < channels; n++)
                {
                    int index = pixel_index + n;
                    ((unsigned char*)output_buffer)[index] = STBIR__ENCODE_LINEAR8(encode_buffer[index]);
                }
            }
            break;

        case STBIR__DECODE(STBIR_TYPE_UINT8, STBIR_COLORSPACE_SRGB):
            for (x=0; x < num_pixels; ++x)
            {
                int pixel_index = x*channels;

                for (n = 0; n < num_nonalpha; n++)
                {
                    int index = pixel_index + nonalpha[n];
                    ((unsigned char*)output_buffer)[index] = stbir__linear_to_srgb_uchar(encode_buffer[index]);
                }

                if (!(stbir_info->flags & STBIR_FLAG_ALPHA_USES_COLORSPACE))
                    ((unsigned char *)output_buffer)[pixel_index + alpha_channel] = STBIR__ENCODE_LINEAR8(encode_buffer[pixel_index+alpha_channel]);
            }
            break;

        case STBIR__DECODE(STBIR_TYPE_UINT16, STBIR_COLORSPACE_LINEAR):
            for (x=0; x < num_pixels; ++x)
            {
                int pixel_index = x*channels;

                for (n = 0; n < channels; n++)
                {
                    int index = pixel_index + n;
                    ((unsigned short*)output_buffer)[index] = STBIR__ENCODE_LINEAR16(encode_buffer[index]);
                }
            }
            break;

        case STBIR__DECODE(STBIR_TYPE_UINT16, STBIR_COLORSPACE_SRGB):
            for (x=0; x < num_pixels; ++x)
            {
                int pixel_index = x*channels;

                for (n = 0; n < num_nonalpha; n++)
                {
                    int index = pixel_index + nonalpha[n];
                    ((unsigned short*)output_buffer)[index] = (unsigned short)STBIR__ROUND_INT(stbir__linear_to_srgb(stbir__saturate(encode_buffer[index])) * stbir__max_uint16_as_float);
                }

                if (!(stbir_info->flags&STBIR_FLAG_ALPHA_USES_COLORSPACE))
                    ((unsigned short*)output_buffer)[pixel_index + alpha_channel] = STBIR__ENCODE_LINEAR16(encode_buffer[pixel_index + alpha_channel]);
            }

            break;

        case STBIR__DECODE(STBIR_TYPE_UINT32, STBIR_COLORSPACE_LINEAR):
            for (x=0; x < num_pixels; ++x)
            {
                int pixel_index = x*channels;

                for (n = 0; n < channels; n++)
                {
                    int index = pixel_index + n;
                    ((unsigned int*)output_buffer)[index] = (unsigned int)STBIR__ROUND_UINT(((double)stbir__saturate(encode_buffer[index])) * stbir__max_uint32_as_float);
                }
            }
            break;

        case STBIR__DECODE(STBIR_TYPE_UINT32, STBIR_COLORSPACE_SRGB):
            for (x=0; x < num_pixels; ++x)
            {
                int pixel_index = x*channels;

                for (n = 0; n < num_nonalpha; n++)
                {
                    int index = pixel_index + nonalpha[n];
                    ((unsigned int*)output_buffer)[index] = (unsigned int)STBIR__ROUND_UINT(((double)stbir__linear_to_srgb(stbir__saturate(encode_buffer[index]))) * stbir__max_uint32_as_float);
                }

                if (!(stbir_info->flags&STBIR_FLAG_ALPHA_USES_COLORSPACE))
                    ((unsigned int*)output_buffer)[pixel_index + alpha_channel] = (unsigned int)STBIR__ROUND_INT(((double)stbir__saturate(encode_buffer[pixel_index + alpha_channel])) * stbir__max_uint32_as_float);
            }
            break;

        case STBIR__DECODE(STBIR_TYPE_FLOAT, STBIR_COLORSPACE_LINEAR):
            for (x=0; x < num_pixels; ++x)
            {
                int pixel_index = x*channels;

                for (n = 0; n < channels; n++)
                {
                    int index = pixel_index + n;
                    ((float*)output_buffer)[index] = encode_buffer[index];
                }
            }
            break;

        case STBIR__DECODE(STBIR_TYPE_FLOAT, STBIR_COLORSPACE_SRGB):
            for (x=0; x < num_pixels; ++x)
            {
                int pixel_index = x*channels;

                for (n = 0; n < num_nonalpha; n++)
                {
                    int index = pixel_index + nonalpha[n];
                    ((float*)output_buffer)[index] = stbir__linear_to_srgb(encode_buffer[index]);
                }

                if (!(stbir_info->flags&STBIR_FLAG_ALPHA_USES_COLORSPACE))
                    ((float*)output_buffer)[pixel_index + alpha_channel] = encode_buffer[pixel_index + alpha_channel];
            }
            break;

        default:
            STBIR_ASSERT(!"Unknown type/colorspace/channels combination.");
            break;
    }
}